

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzer.cpp
# Opt level: O3

void __thiscall USBAnalyzer::USBAnalyzer(USBAnalyzer *this)

{
  _Rb_tree_header *p_Var1;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__USBAnalyzer_0015a540;
  p_Var1 = &(this->mCtrlTransPacketHandlers)._M_t._M_impl.super__Rb_tree_header;
  (this->mCtrlTransPacketHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mCtrlTransPacketHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->mCtrlTransPacketHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mCtrlTransPacketHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mCtrlTransPacketHandlers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mCtrlTransLastPipe).addr = 0;
  (this->mCtrlTransLastPipe).endp = 0;
  USBAnalyzerSettings::USBAnalyzerSettings(&this->mSettings);
  (this->mResults)._M_ptr = (USBAnalyzerResults *)0x0;
  USBSimulationDataGenerator::USBSimulationDataGenerator(&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  return;
}

Assistant:

USBAnalyzer::USBAnalyzer() : mSimulationInitilized( false )
{
    SetAnalyzerSettings( &mSettings );
}